

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O0

Response execute_command(IndexFromCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  byte bVar1;
  bool bVar2;
  string *psVar3;
  runtime_error *this;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  json_value extraout_RDX;
  IndexFromCommand *in_RSI;
  undefined8 in_RDI;
  Response RVar5;
  string filename;
  ifstream inf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string *path_list_fname;
  value_type *in_stack_fffffffffffffd18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd20;
  string local_278 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd98;
  vector<IndexType,_std::allocator<IndexType>_> *in_stack_fffffffffffffda0;
  Task *in_stack_fffffffffffffda8;
  DatabaseSnapshot *in_stack_fffffffffffffdb0;
  Task *in_stack_fffffffffffffdb8;
  DatabaseSnapshot *in_stack_fffffffffffffdc0;
  
  psVar3 = IndexFromCommand::get_path_list_fname_abi_cxx11_(in_RSI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1410e6);
  std::ifstream::ifstream(&stack0xfffffffffffffdb8,(string *)psVar3,_S_bin);
  bVar1 = std::ios::operator!((ios *)(&stack0xfffffffffffffdb8 +
                                     (long)in_stack_fffffffffffffdb8[-1].changes_.
                                           super__Vector_base<DBChange,_std::allocator<DBChange>_>.
                                           _M_impl.super__Vector_impl_data._M_start));
  if ((bVar1 & 1) == 0) {
    std::ios::exceptions
              ((int)&stack0xfffffffffffffdb8 +
               (int)in_stack_fffffffffffffdb8[-1].changes_.
                    super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
                    super__Vector_impl_data._M_start);
    while( true ) {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) break;
      std::__cxx11::string::string(local_278);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&stack0xfffffffffffffdb8,local_278);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      }
      std::__cxx11::string::~string(local_278);
    }
    bVar2 = IndexFromCommand::ensure_unique(in_RSI);
    if (bVar2) {
      IndexFromCommand::get_index_types(in_RSI);
      IndexFromCommand::taints_abi_cxx11_(in_RSI);
      DatabaseSnapshot::recursive_index_paths
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    }
    else {
      IndexFromCommand::get_index_types(in_RSI);
      IndexFromCommand::taints_abi_cxx11_(in_RSI);
      DatabaseSnapshot::force_recursive_index_paths
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (vector<IndexType,_std::allocator<IndexType>_> *)in_stack_fffffffffffffdb0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffda8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffda0);
      in_stack_fffffffffffffd20 = in_RDX;
    }
    Response::ok();
    std::ifstream::~ifstream(&stack0xfffffffffffffdb8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffd20);
    RVar5.content.m_value.object = extraout_RDX.object;
    RVar5.content._0_8_ = in_RDI;
    return (Response)RVar5.content;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"failed to open file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Response execute_command(const IndexFromCommand &cmd, Task *task,
                         const DatabaseSnapshot *snap) {
    const auto &path_list_fname = cmd.get_path_list_fname();

    std::vector<std::string> paths;
    std::ifstream inf(path_list_fname, std::ifstream::binary);

    if (!inf) {
        throw std::runtime_error("failed to open file");
    }

    inf.exceptions(std::ifstream::badbit);

    while (!inf.eof()) {
        std::string filename;
        std::getline(inf, filename);

        if (!filename.empty()) {
            paths.push_back(filename);
        }
    }

    if (cmd.ensure_unique()) {
        snap->recursive_index_paths(task, cmd.get_index_types(), cmd.taints(),
                                    paths);
    } else {
        snap->force_recursive_index_paths(task, cmd.get_index_types(),
                                          cmd.taints(), paths);
    }

    return Response::ok();
}